

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O3

void __thiscall duckdb::AsOfProbeBuffer::BeginLeftScan(AsOfProbeBuffer *this,hash_t scan_bin)

{
  _Head_base<0UL,_duckdb::PayloadScanner_*,_false> _Var1;
  _Head_base<0UL,_duckdb::SBIterator_*,_false> _Var2;
  pointer pGVar3;
  type pPVar4;
  reference pvVar5;
  ulong uVar6;
  reference pvVar7;
  type pGVar8;
  _Head_base<0UL,_duckdb::PayloadScanner_*,_false> _Var9;
  _Head_base<0UL,_duckdb::SBIterator_*,_false> _Var10;
  NotImplementedException *this_00;
  byte bVar11;
  ExpressionType comparison;
  value_type __n;
  string local_48;
  
  pGVar3 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->op->super_PhysicalComparisonJoin).super_PhysicalJoin.
                       super_CachingPhysicalOperator.super_PhysicalOperator.sink_state);
  pPVar4 = unique_ptr<duckdb::PartitionGlobalSinkState,_std::default_delete<duckdb::PartitionGlobalSinkState>,_true>
           ::operator*((unique_ptr<duckdb::PartitionGlobalSinkState,_std::default_delete<duckdb::PartitionGlobalSinkState>,_true>
                        *)&pGVar3[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
                           __data.__list.__next);
  pvVar5 = vector<unsigned_long,_true>::operator[](&pPVar4->bin_groups,scan_bin);
  __n = *pvVar5;
  this->left_group = __n;
  uVar6 = (long)pGVar3[3].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
                __list.__prev -
          *(long *)((long)&pGVar3[3].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex
                   + 0x10) >> 3;
  if (scan_bin < uVar6) {
    pvVar5 = vector<unsigned_long,_true>::operator[]
                       ((vector<unsigned_long,_true> *)
                        ((long)&pGVar3[3].super_StateWithBlockableTasks.lock.super___mutex_base.
                                _M_mutex + 0x10),scan_bin);
    uVar6 = *pvVar5;
    __n = this->left_group;
  }
  this->right_group = uVar6;
  if (__n < (ulong)((long)(pPVar4->bin_groups).
                          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(pPVar4->bin_groups).
                          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3)) {
    bVar11 = this->op->comparison_type - COMPARE_LESSTHAN;
    if (3 < bVar11) {
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Unsupported comparison type for ASOF join","");
      NotImplementedException::NotImplementedException(this_00,&local_48);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar7 = vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
             ::operator[](&pPVar4->hash_groups,__n);
    (this->left_hash).ptr =
         (pvVar7->
         super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
         )._M_t.
         super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
         .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl;
    optional_ptr<duckdb::PartitionGlobalHashGroup,_true>::CheckValid(&this->left_hash);
    pGVar8 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
             ::operator*(&((this->left_hash).ptr)->global_sort);
    if ((pGVar8->sorted_blocks).
        super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pGVar8->sorted_blocks).
        super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      _Var9._M_head_impl = (PayloadScanner *)operator_new(0x18);
      PayloadScanner::PayloadScanner(_Var9._M_head_impl,pGVar8,false);
      _Var1._M_head_impl =
           (this->lhs_scanner).
           super_unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_>
           .super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>._M_head_impl;
      (this->lhs_scanner).
      super_unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>._M_t.
      super___uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_>
      .super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>._M_head_impl = _Var9._M_head_impl;
      if (_Var1._M_head_impl != (PayloadScanner *)0x0) {
        ::std::default_delete<duckdb::PayloadScanner>::operator()
                  ((default_delete<duckdb::PayloadScanner> *)&this->lhs_scanner,_Var1._M_head_impl);
      }
      _Var10._M_head_impl = (SBIterator *)operator_new(0xe8);
      comparison = (ExpressionType)(0x1d1e1b1c >> (bVar11 * '\b' & 0x1f));
      SBIterator::SBIterator(_Var10._M_head_impl,pGVar8,comparison,0);
      _Var2._M_head_impl =
           (this->left_itr).
           super_unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
           super___uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::SBIterator_*,_std::default_delete<duckdb::SBIterator>_>.
           super__Head_base<0UL,_duckdb::SBIterator_*,_false>._M_head_impl;
      (this->left_itr).
      super_unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
      super___uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::SBIterator_*,_std::default_delete<duckdb::SBIterator>_>.
      super__Head_base<0UL,_duckdb::SBIterator_*,_false>._M_head_impl = _Var10._M_head_impl;
      if (_Var2._M_head_impl != (SBIterator *)0x0) {
        ::std::default_delete<duckdb::SBIterator>::operator()
                  ((default_delete<duckdb::SBIterator> *)&this->left_itr,_Var2._M_head_impl);
      }
      if (this->right_group <
          (ulong)((long)pGVar3[3].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
                        __data.__list.__prev -
                  *(long *)((long)&pGVar3[3].super_StateWithBlockableTasks.lock.super___mutex_base.
                                   _M_mutex + 0x10) >> 3)) {
        pvVar7 = vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
                 ::operator[]((vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
                               *)(pGVar3 + 3),this->right_group);
        (this->right_hash).ptr =
             (pvVar7->
             super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
             .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl;
        (this->right_outer).ptr =
             (OuterJoinMarker *)
             (this->right_group * 0x18 +
             pGVar3[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__align);
        optional_ptr<duckdb::PartitionGlobalHashGroup,_true>::CheckValid(&this->right_hash);
        pGVar8 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                 ::operator*(&((this->right_hash).ptr)->global_sort);
        _Var10._M_head_impl = (SBIterator *)operator_new(0xe8);
        SBIterator::SBIterator(_Var10._M_head_impl,pGVar8,comparison,0);
        _Var2._M_head_impl =
             (this->right_itr).
             super_unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
             super___uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::SBIterator_*,_std::default_delete<duckdb::SBIterator>_>.
             super__Head_base<0UL,_duckdb::SBIterator_*,_false>._M_head_impl;
        (this->right_itr).
        super_unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
        super___uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::SBIterator_*,_std::default_delete<duckdb::SBIterator>_>.
        super__Head_base<0UL,_duckdb::SBIterator_*,_false>._M_head_impl = _Var10._M_head_impl;
        if (_Var2._M_head_impl != (SBIterator *)0x0) {
          ::std::default_delete<duckdb::SBIterator>::operator()
                    ((default_delete<duckdb::SBIterator> *)&this->right_itr,_Var2._M_head_impl);
        }
        _Var9._M_head_impl = (PayloadScanner *)operator_new(0x18);
        PayloadScanner::PayloadScanner(_Var9._M_head_impl,pGVar8,false);
        _Var1._M_head_impl =
             (this->rhs_scanner).
             super_unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_>
             .super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>._M_head_impl;
        (this->rhs_scanner).
        super_unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>._M_t.
        super___uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_>
        .super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>._M_head_impl = _Var9._M_head_impl;
        if (_Var1._M_head_impl != (PayloadScanner *)0x0) {
          ::std::default_delete<duckdb::PayloadScanner>::operator()
                    ((default_delete<duckdb::PayloadScanner> *)&this->rhs_scanner,_Var1._M_head_impl
                    );
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void AsOfProbeBuffer::BeginLeftScan(hash_t scan_bin) {
	auto &gsink = op.sink_state->Cast<AsOfGlobalSinkState>();

	auto &lhs_sink = *gsink.lhs_sink;
	left_group = lhs_sink.bin_groups[scan_bin];

	//	Always set right_group too for memory management
	auto &rhs_sink = gsink.rhs_sink;
	if (scan_bin < rhs_sink.bin_groups.size()) {
		right_group = rhs_sink.bin_groups[scan_bin];
	} else {
		right_group = rhs_sink.bin_groups.size();
	}

	if (left_group >= lhs_sink.bin_groups.size()) {
		return;
	}

	auto iterator_comp = ExpressionType::INVALID;
	switch (op.comparison_type) {
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		iterator_comp = ExpressionType::COMPARE_LESSTHANOREQUALTO;
		break;
	case ExpressionType::COMPARE_GREATERTHAN:
		iterator_comp = ExpressionType::COMPARE_LESSTHAN;
		break;
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		iterator_comp = ExpressionType::COMPARE_GREATERTHANOREQUALTO;
		break;
	case ExpressionType::COMPARE_LESSTHAN:
		iterator_comp = ExpressionType::COMPARE_GREATERTHAN;
		break;
	default:
		throw NotImplementedException("Unsupported comparison type for ASOF join");
	}

	left_hash = lhs_sink.hash_groups[left_group].get();
	auto &left_sort = *(left_hash->global_sort);
	if (left_sort.sorted_blocks.empty()) {
		return;
	}
	lhs_scanner = make_uniq<PayloadScanner>(left_sort, false);
	left_itr = make_uniq<SBIterator>(left_sort, iterator_comp);

	// We are only probing the corresponding right side bin, which may be empty
	// If they are empty, we leave the iterator as null so we can emit left matches
	if (right_group < rhs_sink.bin_groups.size()) {
		right_hash = rhs_sink.hash_groups[right_group].get();
		right_outer = gsink.right_outers.data() + right_group;
		auto &right_sort = *(right_hash->global_sort);
		right_itr = make_uniq<SBIterator>(right_sort, iterator_comp);
		rhs_scanner = make_uniq<PayloadScanner>(right_sort, false);
	}
}